

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::MultipleFieldsMapKeyComparator::IsMatchInternal
          (MultipleFieldsMapKeyComparator *this,Message *message1,Message *message2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *key_field_path,int path_index)

{
  FieldDescriptor *field;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Message *message1_00;
  Message *message2_00;
  Reflection *this_00;
  Reflection *this_01;
  SpecificField local_a0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_70;
  Reflection *local_68;
  undefined1 local_60 [8];
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  
  field = (key_field_path->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start[path_index];
  current_parent_fields.
  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = path_index;
  std::
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            *)local_60,parent_fields);
  local_70 = key_field_path;
  if (((long)(key_field_path->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(key_field_path->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) + -1 == (long)path_index) {
    if (*(int *)(field + 0x3c) == 3) {
      bVar1 = CompareRepeatedField
                        (this->message_differencer_,message1,message2,field,
                         (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                          *)local_60);
    }
    else {
      bVar1 = CompareFieldValueUsingParentFields
                        (this->message_differencer_,message1,message2,field,-1,-1,
                         (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                          *)local_60);
    }
    if (bVar1 != false) {
      bVar3 = true;
      goto LAB_00329ea9;
    }
  }
  else {
    (*(message1->super_MessageLite)._vptr_MessageLite[0x13])(message1);
    (*(message2->super_MessageLite)._vptr_MessageLite[0x13])();
    local_68 = this_00;
    bVar1 = Reflection::HasField(this_00,message1,field);
    bVar2 = Reflection::HasField(this_01,message2,field);
    bVar3 = true;
    if (!bVar1 && !bVar2) goto LAB_00329ea9;
    if (bVar1 == bVar2) {
      local_a0.unknown_field_number = -1;
      local_a0.index = -1;
      local_a0.new_index = -1;
      local_a0.unknown_field_set1 = (UnknownFieldSet *)0x0;
      local_a0.unknown_field_set2 = (UnknownFieldSet *)0x0;
      local_a0.unknown_field_index1 = -1;
      local_a0.unknown_field_index2 = -1;
      local_a0.field = field;
      if (current_parent_fields.
          super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          current_parent_fields.
          super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
        ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                  ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                    *)local_60,
                   (iterator)
                   current_parent_fields.
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   ._M_impl.super__Vector_impl_data._M_start,&local_a0);
      }
      else {
        (current_parent_fields.
         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
         ._M_impl.super__Vector_impl_data._M_start)->unknown_field_set2 = (UnknownFieldSet *)0x0;
        (current_parent_fields.
         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
         ._M_impl.super__Vector_impl_data._M_start)->unknown_field_index1 = -1;
        (current_parent_fields.
         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
         ._M_impl.super__Vector_impl_data._M_start)->unknown_field_index2 = -1;
        (current_parent_fields.
         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
         ._M_impl.super__Vector_impl_data._M_start)->index = -1;
        (current_parent_fields.
         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
         ._M_impl.super__Vector_impl_data._M_start)->new_index = -1;
        (current_parent_fields.
         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
         ._M_impl.super__Vector_impl_data._M_start)->unknown_field_set1 = (UnknownFieldSet *)0x0;
        (current_parent_fields.
         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
         ._M_impl.super__Vector_impl_data._M_start)->field = field;
        (current_parent_fields.
         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
         ._M_impl.super__Vector_impl_data._M_start)->unknown_field_number = 0xffffffff;
        (current_parent_fields.
         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
         ._M_impl.super__Vector_impl_data._M_start)->unknown_field_type =
             local_a0.unknown_field_type;
        current_parent_fields.
        super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ._M_impl.super__Vector_impl_data._M_start =
             current_parent_fields.
             super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      message1_00 = Reflection::GetMessage(local_68,message1,field,(MessageFactory *)0x0);
      message2_00 = Reflection::GetMessage(this_01,message2,field,(MessageFactory *)0x0);
      bVar3 = IsMatchInternal(this,message1_00,message2_00,
                              (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                               *)local_60,local_70,
                              current_parent_fields.
                              super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1);
      goto LAB_00329ea9;
    }
  }
  bVar3 = false;
LAB_00329ea9:
  if (local_60 != (undefined1  [8])0x0) {
    operator_delete((void *)local_60);
  }
  return bVar3;
}

Assistant:

bool IsMatchInternal(
      const Message& message1, const Message& message2,
      const std::vector<SpecificField>& parent_fields,
      const std::vector<const FieldDescriptor*>& key_field_path,
      int path_index) const {
    const FieldDescriptor* field = key_field_path[path_index];
    std::vector<SpecificField> current_parent_fields(parent_fields);
    if (path_index == key_field_path.size() - 1) {
      if (field->is_repeated()) {
        if (!message_differencer_->CompareRepeatedField(
                message1, message2, field, &current_parent_fields)) {
          return false;
        }
      } else {
        if (!message_differencer_->CompareFieldValueUsingParentFields(
                message1, message2, field, -1, -1, &current_parent_fields)) {
          return false;
        }
      }
      return true;
    } else {
      const Reflection* reflection1 = message1.GetReflection();
      const Reflection* reflection2 = message2.GetReflection();
      bool has_field1 = reflection1->HasField(message1, field);
      bool has_field2 = reflection2->HasField(message2, field);
      if (!has_field1 && !has_field2) {
        return true;
      }
      if (has_field1 != has_field2) {
        return false;
      }
      SpecificField specific_field;
      specific_field.field = field;
      current_parent_fields.push_back(specific_field);
      return IsMatchInternal(reflection1->GetMessage(message1, field),
                             reflection2->GetMessage(message2, field),
                             current_parent_fields, key_field_path,
                             path_index + 1);
    }
  }